

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visualizer.cpp
# Opt level: O2

void __thiscall Visualizer::generateDot(Visualizer *this,ASTNode *root)

{
  _Elt_pointer ppAVar1;
  int *piVar2;
  string *__rhs;
  deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_> *pdVar3;
  _Elt_pointer ppAVar4;
  _Map_pointer local_f8;
  _Elt_pointer local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  piVar2 = AST::ASTNode::getUniqueID(root);
  std::__cxx11::to_string(&local_d0,*piVar2);
  std::operator+(&local_b0,&local_d0," [label=\"");
  __rhs = AST::ASTNode::getName_abi_cxx11_(root);
  std::operator+(&local_90,&local_b0,__rhs);
  std::operator+(&local_70,&local_90,"\"];\n");
  std::__cxx11::string::append((string *)this);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  pdVar3 = AST::ASTNode::getChildren(root);
  if ((pdVar3->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>)._M_impl.
      super__Deque_impl_data._M_finish._M_cur !=
      (pdVar3->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>)._M_impl.
      super__Deque_impl_data._M_start._M_cur) {
    pdVar3 = AST::ASTNode::getChildren(root);
    ppAVar4 = (pdVar3->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>)._M_impl.
              super__Deque_impl_data._M_start._M_cur;
    local_f0 = (pdVar3->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>)._M_impl.
               super__Deque_impl_data._M_start._M_last;
    local_f8 = (pdVar3->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>)._M_impl.
               super__Deque_impl_data._M_start._M_node;
    ppAVar1 = (pdVar3->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>)._M_impl.
              super__Deque_impl_data._M_finish._M_cur;
    while (ppAVar4 != ppAVar1) {
      piVar2 = AST::ASTNode::getUniqueID(root);
      std::__cxx11::to_string(&local_d0,*piVar2);
      std::operator+(&local_b0,&local_d0," -> ");
      piVar2 = AST::ASTNode::getUniqueID(*ppAVar4);
      std::__cxx11::to_string(&local_50,*piVar2);
      std::operator+(&local_90,&local_b0,&local_50);
      std::operator+(&local_70,&local_90,";\n");
      std::__cxx11::string::append((string *)this);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      generateDot(this,*ppAVar4);
      ppAVar4 = ppAVar4 + 1;
      if (ppAVar4 == local_f0) {
        ppAVar4 = local_f8[1];
        local_f8 = local_f8 + 1;
        local_f0 = ppAVar4 + 0x40;
      }
    }
  }
  return;
}

Assistant:

void Visualizer::generateDot(AST::ASTNode *root) {
    dotFileContent += std::to_string(root->getUniqueID()) + " [label=\"" + root->getName() + "\"];\n";
    if (root->getChildren().empty()) return;
    for (const auto &child: root->getChildren()) {
        dotFileContent += std::to_string(root->getUniqueID()) + " -> " + std::to_string(child->getUniqueID()) + ";\n";
        generateDot(child);
    }
}